

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall
fmt::v7::detail::report_error(detail *this,format_func func,int error_code,string_view message)

{
  char *__ptr;
  size_t __size;
  undefined4 in_register_00000014;
  allocator<char> local_241;
  undefined1 local_240 [8];
  memory_buffer full_message;
  int error_code_local;
  format_func func_local;
  string_view message_local;
  
  full_message._532_4_ = SUB84(func,0);
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_240,&local_241);
  std::allocator<char>::~allocator(&local_241);
  (*(code *)this)(local_240,full_message._532_4_,CONCAT44(in_register_00000014,error_code),
                  message.data_);
  __ptr = buffer<char>::data((buffer<char> *)local_240);
  __size = buffer<char>::size((buffer<char> *)local_240);
  fwrite(__ptr,__size,1,_stderr);
  fputc(10,_stderr);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_240);
  return;
}

Assistant:

FMT_FUNC void report_error(format_func func, int error_code,
                           string_view message) FMT_NOEXCEPT {
  memory_buffer full_message;
  func(full_message, error_code, message);
  // Don't use fwrite_fully because the latter may throw.
  (void)std::fwrite(full_message.data(), full_message.size(), 1, stderr);
  std::fputc('\n', stderr);
}